

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CGL::GLScene::Mesh::render_debugger_node(Mesh *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  
  bVar2 = ImGui::TreeNode(this,"Mesh 0x%x",this);
  if (bVar2) {
    bVar2 = ImGui::TreeNode(this,"Vertices");
    if (bVar2) {
      for (p_Var1 = (this->mesh).vertices.
                    super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
                    super__List_node_base._M_next;
          p_Var1 != (_List_node_base *)&(this->mesh).vertices; p_Var1 = p_Var1->_M_next) {
        DragDouble3("Vertex",(double *)(p_Var1 + 2),0.005);
      }
      ImGui::TreePop();
    }
    if (this->bsdf != (BSDF *)0x0) {
      (*this->bsdf->_vptr_BSDF[4])();
    }
    ImGui::TreePop();
    return;
  }
  return;
}

Assistant:

void Mesh::render_debugger_node()
{
  if (ImGui::TreeNode(this, "Mesh 0x%x", this))
  {
    if (ImGui::TreeNode(this, "Vertices"))
    {
      for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
        DragDouble3("Vertex", &v->position.x, 0.005);
      }
      ImGui::TreePop();
    }

    if (bsdf) bsdf->render_debugger_node();

    ImGui::TreePop();
  }
}